

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtils.cpp
# Opt level: O0

bool OpenMD::isInteger(string *str)

{
  bool bVar1;
  int iVar2;
  reference pcVar3;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__lhs;
  const_iterator i;
  bool result;
  undefined5 in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffcd;
  undefined1 in_stack_ffffffffffffffce;
  undefined1 in_stack_ffffffffffffffcf;
  undefined1 uVar4;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffd0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  byte local_9;
  
  local_9 = 0;
  local_18._M_current = (char *)std::__cxx11::string::begin();
  std::__cxx11::string::end();
  bVar1 = __gnu_cxx::operator!=
                    (in_stack_ffffffffffffffd0,
                     (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_ffffffffffffffcf,
                                 CONCAT16(in_stack_ffffffffffffffce,
                                          CONCAT15(in_stack_ffffffffffffffcd,
                                                   in_stack_ffffffffffffffc8))));
  uVar4 = false;
  if (bVar1) {
    pcVar3 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&local_18);
    in_stack_ffffffffffffffce = true;
    uVar4 = in_stack_ffffffffffffffce;
    if (*pcVar3 != '+') {
      pcVar3 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(&local_18);
      in_stack_ffffffffffffffce = true;
      uVar4 = in_stack_ffffffffffffffce;
      if (*pcVar3 != '-') {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_18);
        iVar2 = isdigit((int)*pcVar3);
        in_stack_ffffffffffffffce = iVar2 != 0;
        uVar4 = in_stack_ffffffffffffffce;
      }
    }
  }
  if ((bool)uVar4 != false) {
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&local_18);
    while( true ) {
      std::__cxx11::string::end();
      bVar1 = __gnu_cxx::operator!=
                        (in_stack_ffffffffffffffd0,
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffffce,
                                                    CONCAT15(in_stack_ffffffffffffffcd,
                                                             in_stack_ffffffffffffffc8))));
      in_stack_ffffffffffffffcd = false;
      if (bVar1) {
        pcVar3 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(&local_18);
        iVar2 = isdigit((int)*pcVar3);
        in_stack_ffffffffffffffcd = iVar2 != 0;
      }
      if ((bool)in_stack_ffffffffffffffcd == false) break;
      __gnu_cxx::
      __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_18);
    }
    __lhs = (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)std::__cxx11::string::end();
    bVar1 = __gnu_cxx::operator==
                      (__lhs,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffffce,
                                                        CONCAT15(in_stack_ffffffffffffffcd,
                                                                 in_stack_ffffffffffffffc8))));
    if (bVar1) {
      local_9 = 1;
    }
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool isInteger(const std::string& str) {
    bool result = false;

    std::string::const_iterator i = str.begin();
    if (i != str.end() && (*i == '+' || *i == '-' || std::isdigit(*i))) {
      ++i;
      while (i != str.end() && std::isdigit(*i))
        ++i;
      if (i == str.end()) result = true;
    }

    return result;
  }